

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O3

DThinker * __thiscall
FDecalColorerAnim::CreateThinker(FDecalColorerAnim *this,DBaseDecal *actor,side_t *wall)

{
  DThinker *this_00;
  int iVar1;
  
  this_00 = (DThinker *)
            M_Malloc_Dbg(0x50,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  DThinker::DThinker(this_00,0x24);
  this_00[1].super_DObject._vptr_DObject = (_func_int **)actor;
  (this_00->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f2b18;
  iVar1 = *(int *)&(this->super_FDecalAnimator).field_0xc + level.maptime;
  *(int *)&this_00[1].super_DObject.Class = iVar1;
  *(int *)((long)&this_00[1].super_DObject.Class + 4) = iVar1 + this->DecayTime;
  *(undefined4 *)&this_00[1].super_DObject.ObjNext = 0xff000000;
  *(anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)&this_00[1].super_DObject.ObjNext + 4) =
       (this->GoalColor).field_0;
  return this_00;
}

Assistant:

DThinker *FDecalColorerAnim::CreateThinker (DBaseDecal *actor, side_t *wall) const
{
	DDecalColorer *Colorer = new DDecalColorer (actor);

	Colorer->TimeToStartDecay = level.maptime + DecayStart;
	Colorer->TimeToEndDecay = Colorer->TimeToStartDecay + DecayTime;
	Colorer->StartColor = 0xff000000;
	Colorer->GoalColor = GoalColor;
	return Colorer;
}